

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O0

void anon_unknown.dwarf_1933e1::ConvolveTestBase::SetUpTestSuite(void)

{
  bool bVar1;
  void *pvVar2;
  char *pcVar3;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffe70;
  unsigned_short **in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  int line;
  char *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  Type type;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult local_140 [2];
  undefined8 local_120;
  Message *in_stack_fffffffffffffee8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffef0;
  AssertionResult local_f0 [2];
  undefined8 local_d0;
  AssertionResult local_c8 [2];
  undefined8 local_a8;
  AssertionResult local_a0 [2];
  undefined8 local_80;
  AssertionResult local_78 [2];
  undefined8 local_58;
  AssertionResult local_50;
  uint local_3c;
  undefined8 local_18;
  AssertionResult local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  pvVar2 = aom_memalign((size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
  (anonymous_namespace)::ConvolveTestBase::input_ = (long)pvVar2 + 1;
  local_18 = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(uchar **)in_stack_fffffffffffffe78
             ,&in_stack_fffffffffffffe70->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffea0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x45138b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x4513e8);
  }
  local_3c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x45146f);
  if (local_3c == 0) {
    (anonymous_namespace)::ConvolveTestBase::ref8_ =
         aom_memalign((size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
    local_58 = 0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (uchar **)in_stack_fffffffffffffe78,&in_stack_fffffffffffffe70->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x451513);
      type = (Type)((ulong)pcVar3 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x451570);
    }
    local_3c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x4515f7);
    if (local_3c == 0) {
      (anonymous_namespace)::ConvolveTestBase::output_ =
           aom_memalign((size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
      local_80 = 0;
      testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (uchar **)in_stack_fffffffffffffe78,&in_stack_fffffffffffffe70->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffe90 =
             testing::AssertionResult::failure_message((AssertionResult *)0x45169b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                   (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,in_stack_fffffffffffffee8)
        ;
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
        testing::Message::~Message((Message *)0x4516f8);
      }
      local_3c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x45177f);
      if (local_3c == 0) {
        (anonymous_namespace)::ConvolveTestBase::output_ref_ =
             aom_memalign((size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
        local_a8 = 0;
        testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                  (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   (uchar **)in_stack_fffffffffffffe78,&in_stack_fffffffffffffe70->data_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffea0);
          in_stack_fffffffffffffe88 =
               testing::AssertionResult::failure_message((AssertionResult *)0x451823);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                     (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                     in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
          testing::Message::~Message((Message *)0x451880);
        }
        local_3c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x451907);
        if (local_3c == 0) {
          pvVar2 = aom_memalign((size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80)
          ;
          (anonymous_namespace)::ConvolveTestBase::input16_ = (long)pvVar2 + 2;
          local_d0 = 0;
          testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                    (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     &in_stack_fffffffffffffe70->data_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffea0);
            in_stack_fffffffffffffe80 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x4519af);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                       (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                       in_stack_fffffffffffffee8);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
            testing::Message::~Message((Message *)0x451a0c);
          }
          local_3c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x451a93);
          if (local_3c == 0) {
            (anonymous_namespace)::ConvolveTestBase::ref16_ =
                 aom_memalign((size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
            testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                      (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                       ,&in_stack_fffffffffffffe70->data_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffea0);
              in_stack_fffffffffffffe78 =
                   (unsigned_short **)
                   testing::AssertionResult::failure_message((AssertionResult *)0x451b37);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                         (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                         in_stack_fffffffffffffee8);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
              testing::Message::~Message((Message *)0x451b94);
            }
            local_3c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x451c1b);
            if (local_3c == 0) {
              (anonymous_namespace)::ConvolveTestBase::output16_ =
                   aom_memalign((size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80)
              ;
              local_120 = 0;
              testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                        (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe78,&in_stack_fffffffffffffe70->data_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffee8);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffea0);
                in_stack_fffffffffffffe70 =
                     (AssertHelper *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x451cb6);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                           (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80
                          );
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                           in_stack_fffffffffffffee8);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
                testing::Message::~Message((Message *)0x451d04);
              }
              local_3c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x451d85);
              if (local_3c == 0) {
                (anonymous_namespace)::ConvolveTestBase::output16_ref_ =
                     aom_memalign((size_t)in_stack_fffffffffffffe88,
                                  (size_t)in_stack_fffffffffffffe80);
                testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                          (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                           in_stack_fffffffffffffe78,&in_stack_fffffffffffffe70->data_);
                line = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffea0);
                  testing::AssertionResult::failure_message((AssertionResult *)0x451e17);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,line,
                             in_stack_fffffffffffffe80);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                             in_stack_fffffffffffffee8);
                  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
                  testing::Message::~Message((Message *)0x451e63);
                }
                local_3c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x451edb);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void SetUpTestSuite() {
    // Force input_ to be unaligned, output to be 16 byte aligned.
    input_ = reinterpret_cast<uint8_t *>(
                 aom_memalign(kDataAlignment, kInputBufferSize + 1)) +
             1;
    ASSERT_NE(input_, nullptr);
    ref8_ = reinterpret_cast<uint8_t *>(
        aom_memalign(kDataAlignment, kOutputStride * kMaxDimension));
    ASSERT_NE(ref8_, nullptr);
    output_ = reinterpret_cast<uint8_t *>(
        aom_memalign(kDataAlignment, kOutputBufferSize));
    ASSERT_NE(output_, nullptr);
    output_ref_ = reinterpret_cast<uint8_t *>(
        aom_memalign(kDataAlignment, kOutputBufferSize));
    ASSERT_NE(output_ref_, nullptr);
    input16_ = reinterpret_cast<uint16_t *>(aom_memalign(
                   kDataAlignment, (kInputBufferSize + 1) * sizeof(uint16_t))) +
               1;
    ASSERT_NE(input16_, nullptr);
    ref16_ = reinterpret_cast<uint16_t *>(aom_memalign(
        kDataAlignment, kOutputStride * kMaxDimension * sizeof(uint16_t)));
    ASSERT_NE(ref16_, nullptr);
    output16_ = reinterpret_cast<uint16_t *>(
        aom_memalign(kDataAlignment, (kOutputBufferSize) * sizeof(uint16_t)));
    ASSERT_NE(output16_, nullptr);
    output16_ref_ = reinterpret_cast<uint16_t *>(
        aom_memalign(kDataAlignment, (kOutputBufferSize) * sizeof(uint16_t)));
    ASSERT_NE(output16_ref_, nullptr);
  }